

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Request * __thiscall
kj::anon_unknown_31::HttpClientImpl::request
          (Request *__return_storage_ptr__,HttpClientImpl *this,HttpMethod method,StringPtr url,
          HttpHeaders *headers,Maybe<unsigned_long> expectedBodySize)

{
  kj *this_00;
  HttpOutputStream *this_01;
  ArrayPtr<const_kj::StringPtr> connectionHeaders;
  bool bVar1;
  AsyncOutputStream *pAVar2;
  long lVar3;
  TransformPromiseNodeBase *this_02;
  unsigned_long *params;
  uint uVar4;
  long *plVar5;
  char *pcVar6;
  long *plVar7;
  Own<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter> local_178;
  Array<char> local_168;
  Own<kj::AsyncOutputStream> bodyStream;
  String lengthStr;
  Own<kj::_::PromiseNode> local_f0;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:3197:11),_kj::Maybe<kj::HttpHeaders::Response>_>
  responsePromise;
  Array<char> local_c0;
  Fault f;
  long alStack_a0 [14];
  
  if (this->upgraded == true) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xc48,FAILED,"!upgraded",
               "\"can\'t make further requests on this HttpClient because it has been or is in the process \" \"of being upgraded\""
               ,(char (*) [106])
                "can\'t make further requests on this HttpClient because it has been or is in the process of being upgraded"
              );
    _::Debug::Fault::fatal(&f);
  }
  if (this->closed == true) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[78]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xc4a,FAILED,"!closed",
               "\"this HttpClient\'s connection has been closed by the server or due to an error\"",
               (char (*) [78])
               "this HttpClient\'s connection has been closed by the server or due to an error");
    _::Debug::Fault::fatal(&f);
  }
  if ((((this->httpOutput).inBody != false) || ((this->httpOutput).broken != false)) ||
     (((this->httpOutput).writeInProgress & 1U) != 0)) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[75]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xc4c,FAILED,"httpOutput.canReuse()",
               "\"can\'t start new request until previous request body has been fully written\"",
               (char (*) [75])
               "can\'t start new request until previous request body has been fully written");
    _::Debug::Fault::fatal(&f);
  }
  plVar5 = alStack_a0 + 10;
  plVar7 = alStack_a0 + 9;
  this_01 = &this->httpOutput;
  _::NullableValue<kj::Promise<void>_>::operator=(&(this->closeWatcherTask).ptr,(void *)0x0);
  lVar3 = 8;
  do {
    *(char **)((long)&local_c0.disposer + lVar3) = "";
    *(undefined8 *)((long)alStack_a0 + lVar3 + -8) = 1;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x78);
  lengthStr.content.disposer = (ArrayDisposer *)0x0;
  lengthStr.content.ptr = (char *)0x0;
  lengthStr.content.size_ = 0;
  this_00 = (kj *)(expectedBodySize.ptr._0_8_ + 8);
  if (*(char *)expectedBodySize.ptr._0_8_ == '\x01') {
    if ((method < POST) && (*(long *)this_00 == 0)) {
LAB_002b3274:
      bVar1 = false;
      goto LAB_002b3291;
    }
    str<unsigned_long&>((String *)&local_168,this_00,params);
    Array<char>::operator=(&lengthStr.content,&local_168);
    Array<char>::~Array(&local_168);
    pcVar6 = "";
    if (lengthStr.content.size_ != 0) {
      pcVar6 = lengthStr.content.ptr;
    }
    lVar3 = lengthStr.content.size_ + (lengthStr.content.size_ == 0);
  }
  else {
    lVar3 = 8;
    pcVar6 = "chunked";
    if (method < POST) {
      plVar7 = alStack_a0 + 0xb;
      plVar5 = alStack_a0 + 0xc;
      if ((headers->indexedHeaders).ptr[6].content.size_ < 2) goto LAB_002b3274;
    }
    else {
      plVar7 = alStack_a0 + 0xb;
      plVar5 = alStack_a0 + 0xc;
    }
  }
  *plVar7 = (long)pcVar6;
  *plVar5 = lVar3;
  bVar1 = true;
LAB_002b3291:
  connectionHeaders.size_ = 7;
  connectionHeaders.ptr = (StringPtr *)&f;
  HttpHeaders::serializeRequest((String *)&local_c0,headers,method,url,connectionHeaders);
  HttpOutputStream::writeHeaders(this_01,(String *)&local_c0);
  Array<char>::~Array(&local_c0);
  bodyStream.disposer = (Disposer *)0x0;
  bodyStream.ptr = (AsyncOutputStream *)0x0;
  if (bVar1) {
    if (*(char *)expectedBodySize.ptr._0_8_ == '\x01') {
      heap<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter,kj::(anonymous_namespace)::HttpOutputStream&,unsigned_long&>
                ((kj *)&local_178,this_01,(unsigned_long *)this_00);
      local_168.ptr = (char *)local_178.disposer;
      local_168.size_ = (size_t)local_178.ptr;
      local_178.ptr = (HttpFixedLengthEntityWriter *)0x0;
      Own<kj::AsyncOutputStream>::operator=(&bodyStream,(Own<kj::AsyncOutputStream> *)&local_168);
      Own<kj::AsyncOutputStream>::dispose((Own<kj::AsyncOutputStream> *)&local_168);
      Own<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter>::~Own(&local_178);
    }
    else {
      heap<kj::(anonymous_namespace)::HttpChunkedEntityWriter,kj::(anonymous_namespace)::HttpOutputStream&>
                ((kj *)&local_178,this_01);
      local_168.ptr = (char *)local_178.disposer;
      local_168.size_ = (size_t)local_178.ptr;
      local_178.ptr = (HttpFixedLengthEntityWriter *)0x0;
      Own<kj::AsyncOutputStream>::operator=(&bodyStream,(Own<kj::AsyncOutputStream> *)&local_168);
      Own<kj::AsyncOutputStream>::dispose((Own<kj::AsyncOutputStream> *)&local_168);
      Own<kj::(anonymous_namespace)::HttpChunkedEntityWriter>::~Own
                ((Own<kj::(anonymous_namespace)::HttpChunkedEntityWriter> *)&local_178);
    }
  }
  else {
    HttpOutputStream::finishBody(this_01);
    heap<kj::(anonymous_namespace)::HttpNullEntityWriter>();
    local_168.ptr = (char *)local_178.disposer;
    local_168.size_ = (size_t)local_178.ptr;
    local_178.ptr = (HttpFixedLengthEntityWriter *)0x0;
    Own<kj::AsyncOutputStream>::operator=(&bodyStream,(Own<kj::AsyncOutputStream> *)&local_168);
    Own<kj::AsyncOutputStream>::dispose((Own<kj::AsyncOutputStream> *)&local_168);
    Own<kj::(anonymous_namespace)::HttpNullEntityWriter>::~Own
              ((Own<kj::(anonymous_namespace)::HttpNullEntityWriter> *)&local_178);
  }
  uVar4 = this->counter + 1;
  this->counter = uVar4;
  HttpInputStreamImpl::readResponseHeaders((HttpInputStreamImpl *)&local_f0);
  this_02 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_02,&local_f0,
             _::
             TransformPromiseNode<kj::HttpClient::Response,_kj::Maybe<kj::HttpHeaders::Response>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3197:11),_kj::_::PropagateException>
             ::anon_class_16_3_0b5a0f4b_for_func::operator());
  (this_02->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0042a250;
  this_02[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)this;
  *(HttpMethod *)&this_02[1].dependency.disposer = method;
  *(uint *)((long)&this_02[1].dependency.disposer + 4) = uVar4;
  local_168.ptr =
       (char *)&_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::HttpClient::Response,kj::Maybe<kj::HttpHeaders::Response>,kj::(anonymous_namespace)::HttpClientImpl::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::Maybe<kj::HttpHeaders::Response>&&)#1},kj::_::PropagateException>>
                ::instance;
  local_178.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::HttpClient::Response,kj::Maybe<kj::HttpHeaders::Response>,kj::(anonymous_namespace)::HttpClientImpl::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::Maybe<kj::HttpHeaders::Response>&&)#1},kj::_::PropagateException>>
        ::instance;
  local_168.size_ = 0;
  responsePromise.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::HttpClient::Response,kj::Maybe<kj::HttpHeaders::Response>,kj::(anonymous_namespace)::HttpClientImpl::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::Maybe<kj::HttpHeaders::Response>&&)#1},kj::_::PropagateException>>
        ::instance;
  local_178.ptr = (HttpFixedLengthEntityWriter *)0x0;
  responsePromise.super_PromiseBase.node.ptr = (PromiseNode *)this_02;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_178);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_168);
  Own<kj::_::PromiseNode>::dispose(&local_f0);
  pAVar2 = bodyStream.ptr;
  bodyStream.ptr = (AsyncOutputStream *)0x0;
  (__return_storage_ptr__->body).disposer = bodyStream.disposer;
  (__return_storage_ptr__->body).ptr = pAVar2;
  (__return_storage_ptr__->response).super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::HttpClient::Response,kj::Maybe<kj::HttpHeaders::Response>,kj::(anonymous_namespace)::HttpClientImpl::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::Maybe<kj::HttpHeaders::Response>&&)#1},kj::_::PropagateException>>
        ::instance;
  (__return_storage_ptr__->response).super_PromiseBase.node.ptr = (PromiseNode *)this_02;
  responsePromise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&responsePromise);
  Own<kj::AsyncOutputStream>::dispose(&bodyStream);
  Array<char>::~Array(&lengthStr.content);
  return __return_storage_ptr__;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = nullptr) override {
    KJ_REQUIRE(!upgraded,
        "can't make further requests on this HttpClient because it has been or is in the process "
        "of being upgraded");
    KJ_REQUIRE(!closed,
        "this HttpClient's connection has been closed by the server or due to an error");
    KJ_REQUIRE(httpOutput.canReuse(),
        "can't start new request until previous request body has been fully written");
    closeWatcherTask = nullptr;

    kj::StringPtr connectionHeaders[HttpHeaders::CONNECTION_HEADERS_COUNT];
    kj::String lengthStr;

    bool isGet = method == HttpMethod::GET || method == HttpMethod::HEAD;
    bool hasBody;

    KJ_IF_MAYBE(s, expectedBodySize) {
      if (isGet && *s == 0) {
        // GET with empty body; don't send any Content-Length.
        hasBody = false;
      } else {
        lengthStr = kj::str(*s);
        connectionHeaders[HttpHeaders::BuiltinIndices::CONTENT_LENGTH] = lengthStr;
        hasBody = true;
      }
    } else {
      if (isGet && headers.get(HttpHeaderId::TRANSFER_ENCODING) == nullptr) {
        // GET with empty body; don't send any Transfer-Encoding.
        hasBody = false;
      } else {
        // HACK: Normally GET requests shouldn't have bodies. But, if the caller set a
        //   Transfer-Encoding header on a GET, we use this as a special signal that it might
        //   actually want to send a body. This allows pass-through of a GET request with a chunked
        //   body to "just work". We strongly discourage writing any new code that sends
        //   full-bodied GETs.
        connectionHeaders[HttpHeaders::BuiltinIndices::TRANSFER_ENCODING] = "chunked";
        hasBody = true;
      }
    }

    httpOutput.writeHeaders(headers.serializeRequest(method, url, connectionHeaders));

    kj::Own<kj::AsyncOutputStream> bodyStream;
    if (!hasBody) {
      // No entity-body.
      httpOutput.finishBody();
      bodyStream = heap<HttpNullEntityWriter>();
    } else KJ_IF_MAYBE(s, expectedBodySize) {
      bodyStream = heap<HttpFixedLengthEntityWriter>(httpOutput, *s);
    } else {
      bodyStream = heap<HttpChunkedEntityWriter>(httpOutput);
    }